

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O0

bool hasValidValves(Network *nw)

{
  bool bVar1;
  int iVar2;
  reference ppLVar3;
  NetworkError *this;
  ENerror *e;
  string local_60 [32];
  Valve *local_40;
  Valve *valve;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  bool result;
  Network *nw_local;
  
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(&nw->links);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(&nw->links);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                *)&link);
    if (!bVar1) {
      return true;
    }
    ppLVar3 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    valve = (Valve *)*ppLVar3;
    iVar2 = (*(valve->super_Link).super_Element._vptr_Element[2])();
    if ((iVar2 == 2) &&
       (((local_40 = valve, (((valve->super_Link).toNode)->fixedGrade & 1U) != 0 &&
         (valve->valveType == PRV)) ||
        (((((valve->super_Link).fromNode)->fixedGrade & 1U) != 0 && (valve->valveType == PSV))))))
    break;
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  this = (NetworkError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_60,(string *)&(local_40->super_Link).super_Element.name);
  NetworkError::NetworkError(this,0,(string *)local_60);
  __cxa_throw(this,&NetworkError::typeinfo,NetworkError::~NetworkError);
}

Assistant:

bool hasValidValves(Network* nw)
{
    bool result = true;
    for (Link* link : nw->links)
    {
        if ( link->type() != Link::VALVE ) continue;
        try
        {
            Valve* valve = static_cast<Valve*>(link);
            if ( (link->toNode->fixedGrade && valve->valveType == Valve::PRV) ||
                 (link->fromNode->fixedGrade && valve->valveType == Valve::PSV) )
            {
                throw NetworkError(NetworkError::ILLEGAL_VALVE_CONNECTION,
                                   valve->name);
            }
        }
        catch (ENerror const& e)
        {
            nw->msgLog << e.msg;
            result = false;
        }

//////////  TO DO: Add checks for valves in series, etc.  ////////////////

    }
    return result;

}